

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Container.cpp
# Opt level: O1

void __thiscall
database::Container::_UpdateValueForIndex
          (Container *this,size_t *index,impl_insert_update_type *new_value)

{
  iterator iVar1;
  _Rb_tree_node_base *p_Var2;
  _Base_ptr p_Var3;
  _Rb_tree_header *p_Var4;
  long lVar5;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparableString>
  pair;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparableString>
  local_70;
  
  if ((new_value->_M_t)._M_impl.super__Rb_tree_header._M_node_count != 0) {
    p_Var3 = (new_value->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var4 = &(new_value->_M_t)._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var3 != p_Var4) {
      do {
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparableString>
        ::pair(&local_70,
               (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparableString>
                *)(p_Var3 + 1));
        p_Var2 = (this->m_schema)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        iVar1 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::DataType>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::DataType>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::DataType>_>_>
                ::find(&(this->m_schema)._M_t,&local_70.first);
        lVar5 = 0;
        while (p_Var2 != iVar1._M_node) {
          p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2);
          lVar5 = lVar5 + 1;
        }
        std::__cxx11::string::_M_assign
                  ((string *)
                   (*index * 0x20 +
                   *(long *)(*(long *)&(((this->m_data)._M_t.
                                         super___uniq_ptr_impl<std::vector<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>,_std::allocator<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>_>_>,_std::default_delete<std::vector<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>,_std::allocator<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>_>_>_>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_std::vector<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>,_std::allocator<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>_>_>_*,_std::default_delete<std::vector<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>,_std::allocator<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>_>_>_>_>
                                         .
                                         super__Head_base<0UL,_std::vector<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>,_std::allocator<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>_>_>_*,_false>
                                        ._M_head_impl)->
                                       super__Vector_base<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>,_std::allocator<std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>_>_>
                                       )._M_impl + lVar5 * 0x18)));
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70.second.m_string._M_dataplus._M_p != &local_70.second.m_string.field_2) {
          operator_delete(local_70.second.m_string._M_dataplus._M_p,
                          local_70.second.m_string.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70.first._M_dataplus._M_p != &local_70.first.field_2) {
          operator_delete(local_70.first._M_dataplus._M_p,
                          local_70.first.field_2._M_allocated_capacity + 1);
        }
        p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
      } while ((_Rb_tree_header *)p_Var3 != p_Var4);
    }
  }
  return;
}

Assistant:

void database::Container::_UpdateValueForIndex(const size_t& index,const database::impl_insert_update_type& new_value)
{
  if(new_value.empty()) return;
  for(auto pair: new_value)
  {
    size_t column_index = std::distance(m_schema.begin(),m_schema.find(pair.first));
    m_data -> operator[](column_index)[index] = pair.second;
  }
}